

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_UpcastCopyFrom_Test::
GeneratedMessageTest_UpcastCopyFrom_Test(GeneratedMessageTest_UpcastCopyFrom_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0164faa8;
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, UpcastCopyFrom) {
  // Test the CopyFrom method that takes in the generic const Message&
  // parameter.
  UNITTEST::TestAllTypes message1, message2;

  TestUtil::SetAllFields(&message1);

  const Message* source = absl::implicit_cast<const Message*>(&message1);
  message2.CopyFrom(*source);

  TestUtil::ExpectAllFieldsSet(message2);
}